

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

void google::protobuf::compiler::java::PrintEnumVerifierLogic
               (Printer *printer,FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,char *var_name,char *terminating_string,bool enforce_lite)

{
  AlphaNum *c;
  undefined3 in_register_00000089;
  string enum_verifier_string;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  char *local_58;
  size_t sStack_50;
  
  if (CONCAT31(in_register_00000089,enforce_lite) == 0) {
    local_58 = 
    "new com.google.protobuf.Internal.EnumVerifier() {\n        @java.lang.Override\n        public boolean isInRange(int number) {\n          return "
    ;
    sStack_50 = 0x8e;
    c = (AlphaNum *)terminating_string;
    local_88.piece_data_ = var_name;
    local_88.piece_size_ = strlen(var_name);
    var_name = (char *)&local_b8;
    local_b8.piece_data_ = ".forNumber(number) != null;\n        }\n      }";
    local_b8.piece_size_ = 0x2d;
    StrCat_abi_cxx11_(&local_d8,(protobuf *)&local_58,&local_88,(AlphaNum *)var_name,c);
  }
  else {
    local_58 = var_name;
    sStack_50 = strlen(var_name);
    local_88.piece_data_ = ".internalGetVerifier()";
    local_88.piece_size_ = 0x16;
    StrCat_abi_cxx11_(&local_d8,(protobuf *)&local_58,&local_88,(AlphaNum *)var_name);
  }
  local_58 = local_d8._M_dataplus._M_p;
  sStack_50 = local_d8._M_string_length;
  local_88.piece_data_ = terminating_string;
  local_88.piece_size_ = strlen(terminating_string);
  StrCat_abi_cxx11_((string *)&local_b8,(protobuf *)&local_58,&local_88,(AlphaNum *)var_name);
  io::Printer::Print(printer,variables,local_b8.piece_data_);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void PrintEnumVerifierLogic(io::Printer* printer,
                            const FieldDescriptor* descriptor,
                            const std::map<std::string, std::string>& variables,
                            const char* var_name,
                            const char* terminating_string, bool enforce_lite) {
  std::string enum_verifier_string =
      enforce_lite ? StrCat(var_name, ".internalGetVerifier()")
                   : StrCat(
                         "new com.google.protobuf.Internal.EnumVerifier() {\n"
                         "        @java.lang.Override\n"
                         "        public boolean isInRange(int number) {\n"
                         "          return ",
                         var_name,
                         ".forNumber(number) != null;\n"
                         "        }\n"
                         "      }");
  printer->Print(
      variables,
      StrCat(enum_verifier_string, terminating_string).c_str());
}